

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::DoubleAPFloat::addWithSpecial
          (DoubleAPFloat *this,DoubleAPFloat *LHS,DoubleAPFloat *RHS,DoubleAPFloat *Out,
          roundingMode RM)

{
  bool bVar1;
  bool bVar2;
  fltCategory fVar3;
  type pAVar4;
  fltSemantics *pfVar5;
  undefined1 local_b8 [8];
  APFloat CC;
  APFloat C;
  APFloat AA;
  APFloat A;
  roundingMode RM_local;
  DoubleAPFloat *Out_local;
  DoubleAPFloat *RHS_local;
  DoubleAPFloat *LHS_local;
  DoubleAPFloat *this_local;
  
  fVar3 = getCategory(LHS);
  if (fVar3 == fcNaN) {
    operator=(Out,LHS);
    this_local._4_4_ = opOK;
  }
  else {
    fVar3 = getCategory(RHS);
    if (fVar3 == fcNaN) {
      operator=(Out,RHS);
      this_local._4_4_ = opOK;
    }
    else {
      fVar3 = getCategory(LHS);
      if (fVar3 == fcZero) {
        operator=(Out,RHS);
        this_local._4_4_ = opOK;
      }
      else {
        fVar3 = getCategory(RHS);
        if (fVar3 == fcZero) {
          operator=(Out,LHS);
          this_local._4_4_ = opOK;
        }
        else {
          fVar3 = getCategory(LHS);
          if ((fVar3 == fcInfinity) && (fVar3 = getCategory(RHS), fVar3 == fcInfinity)) {
            bVar1 = isNegative(LHS);
            bVar2 = isNegative(RHS);
            if (bVar1 != bVar2) {
              bVar1 = isNegative(Out);
              makeNaN(Out,false,bVar1,(APInt *)0x0);
              return opInvalidOp;
            }
          }
          fVar3 = getCategory(LHS);
          if (fVar3 == fcInfinity) {
            operator=(Out,LHS);
            this_local._4_4_ = opOK;
          }
          else {
            fVar3 = getCategory(RHS);
            if (fVar3 == fcInfinity) {
              operator=(Out,RHS);
              this_local._4_4_ = opOK;
            }
            else {
              fVar3 = getCategory(LHS);
              bVar1 = false;
              if (fVar3 == fcNormal) {
                fVar3 = getCategory(RHS);
                bVar1 = fVar3 == fcNormal;
              }
              if (!bVar1) {
                __assert_fail("LHS.getCategory() == fcNormal && RHS.getCategory() == fcNormal",
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                              ,0xfb9,
                              "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                             );
              }
              pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::
                       operator[](&LHS->Floats,0);
              APFloat::APFloat((APFloat *)((long)&AA.U + 0x10),pAVar4);
              pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::
                       operator[](&LHS->Floats,1);
              APFloat::APFloat((APFloat *)((long)&C.U + 0x10),pAVar4);
              pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::
                       operator[](&RHS->Floats,0);
              APFloat::APFloat((APFloat *)((long)&CC.U + 0x10),pAVar4);
              pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::
                       operator[](&RHS->Floats,1);
              APFloat::APFloat((APFloat *)local_b8,pAVar4);
              pfVar5 = APFloat::getSemantics((APFloat *)((long)&AA.U + 0x10));
              if (pfVar5 != (fltSemantics *)semIEEEdouble) {
                __assert_fail("&A.getSemantics() == &semIEEEdouble",
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                              ,0xfbd,
                              "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                             );
              }
              pfVar5 = APFloat::getSemantics((APFloat *)((long)&C.U + 0x10));
              if (pfVar5 != (fltSemantics *)semIEEEdouble) {
                __assert_fail("&AA.getSemantics() == &semIEEEdouble",
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                              ,0xfbe,
                              "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                             );
              }
              pfVar5 = APFloat::getSemantics((APFloat *)((long)&CC.U + 0x10));
              if (pfVar5 != (fltSemantics *)semIEEEdouble) {
                __assert_fail("&C.getSemantics() == &semIEEEdouble",
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                              ,0xfbf,
                              "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                             );
              }
              pfVar5 = APFloat::getSemantics((APFloat *)local_b8);
              if (pfVar5 != (fltSemantics *)semIEEEdouble) {
                __assert_fail("&CC.getSemantics() == &semIEEEdouble",
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                              ,0xfc0,
                              "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                             );
              }
              pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::
                       operator[](&Out->Floats,0);
              pfVar5 = APFloat::getSemantics(pAVar4);
              if (pfVar5 != (fltSemantics *)semIEEEdouble) {
                __assert_fail("&Out.Floats[0].getSemantics() == &semIEEEdouble",
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                              ,0xfc1,
                              "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                             );
              }
              pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::
                       operator[](&Out->Floats,1);
              pfVar5 = APFloat::getSemantics(pAVar4);
              if (pfVar5 != (fltSemantics *)semIEEEdouble) {
                __assert_fail("&Out.Floats[1].getSemantics() == &semIEEEdouble",
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                              ,0xfc2,
                              "APFloat::opStatus llvm::detail::DoubleAPFloat::addWithSpecial(const DoubleAPFloat &, const DoubleAPFloat &, DoubleAPFloat &, roundingMode)"
                             );
              }
              this_local._4_4_ =
                   addImpl(Out,(APFloat *)((long)&AA.U + 0x10),(APFloat *)((long)&C.U + 0x10),
                           (APFloat *)((long)&CC.U + 0x10),(APFloat *)local_b8,RM);
              APFloat::~APFloat((APFloat *)local_b8);
              APFloat::~APFloat((APFloat *)((long)&CC.U + 0x10));
              APFloat::~APFloat((APFloat *)((long)&C.U + 0x10));
              APFloat::~APFloat((APFloat *)((long)&AA.U + 0x10));
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

APFloat::opStatus DoubleAPFloat::addWithSpecial(const DoubleAPFloat &LHS,
                                                const DoubleAPFloat &RHS,
                                                DoubleAPFloat &Out,
                                                roundingMode RM) {
  if (LHS.getCategory() == fcNaN) {
    Out = LHS;
    return opOK;
  }
  if (RHS.getCategory() == fcNaN) {
    Out = RHS;
    return opOK;
  }
  if (LHS.getCategory() == fcZero) {
    Out = RHS;
    return opOK;
  }
  if (RHS.getCategory() == fcZero) {
    Out = LHS;
    return opOK;
  }
  if (LHS.getCategory() == fcInfinity && RHS.getCategory() == fcInfinity &&
      LHS.isNegative() != RHS.isNegative()) {
    Out.makeNaN(false, Out.isNegative(), nullptr);
    return opInvalidOp;
  }
  if (LHS.getCategory() == fcInfinity) {
    Out = LHS;
    return opOK;
  }
  if (RHS.getCategory() == fcInfinity) {
    Out = RHS;
    return opOK;
  }
  assert(LHS.getCategory() == fcNormal && RHS.getCategory() == fcNormal);

  APFloat A(LHS.Floats[0]), AA(LHS.Floats[1]), C(RHS.Floats[0]),
      CC(RHS.Floats[1]);
  assert(&A.getSemantics() == &semIEEEdouble);
  assert(&AA.getSemantics() == &semIEEEdouble);
  assert(&C.getSemantics() == &semIEEEdouble);
  assert(&CC.getSemantics() == &semIEEEdouble);
  assert(&Out.Floats[0].getSemantics() == &semIEEEdouble);
  assert(&Out.Floats[1].getSemantics() == &semIEEEdouble);
  return Out.addImpl(A, AA, C, CC, RM);
}